

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O0

void get_max_cover_static2<448ul,3>
               (vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *sets,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *names,vector<unsigned_long,_std::allocator<unsigned_long>_> *_begin,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *_end,bool print_progress)

{
  value_type vVar1;
  byte bVar2;
  bool bVar3;
  const_reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  size_type sVar7;
  reference this;
  const_reference pvVar8;
  ulong local_138;
  size_t j;
  array<unsigned_long,_3UL> *collection;
  iterator __end0;
  iterator __begin0;
  vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_> *__range1
  ;
  anon_class_56_7_64ceefa5 local_108;
  unsigned_long local_d0;
  size_t progress;
  size_t this_count;
  undefined1 local_b0 [8];
  pair<unsigned_long,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
  best;
  size_t i;
  collection end;
  collection indices;
  size_t N;
  size_type n;
  vector<std::bitset<448UL>,_std::allocator<std::bitset<448UL>_>_> binary_sets;
  bool print_progress_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *_end_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *_begin_local;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *names_local;
  vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *sets_local;
  
  binary_sets.super__Vector_base<std::bitset<448UL>,_std::allocator<std::bitset<448UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = print_progress;
  BitSetsFromSets<448ul>
            ((vector<std::bitset<448UL>,_std::allocator<std::bitset<448UL>_>_> *)&n,sets,names);
  N = std::
      vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::size(sets);
  indices._M_elems[2] = nchoosek(N,3);
  for (best.second.
       super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      best.second.
      super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage < (pointer)0x3;
      best.second.
      super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)(best.second.
                            super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems + 1)) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (_begin,(size_type)
                               best.second.
                               super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    vVar1 = *pvVar4;
    pvVar5 = std::array<unsigned_long,_3UL>::operator[]
                       ((array<unsigned_long,_3UL> *)(end._M_elems + 2),
                        (size_type)
                        best.second.
                        super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *pvVar5 = vVar1;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (_end,(size_type)
                             best.second.
                             super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    vVar1 = *pvVar4;
    pvVar5 = std::array<unsigned_long,_3UL>::operator[]
                       ((array<unsigned_long,_3UL> *)&i,
                        (size_type)
                        best.second.
                        super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *pvVar5 = vVar1;
  }
  std::
  pair<unsigned_long,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
  ::
  pair<unsigned_long,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>,_true>
            ((pair<unsigned_long,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
              *)local_b0);
  local_b0 = (undefined1  [8])0x0;
  std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>::
  clear((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_> *)
        &best);
  bVar2 = binary_sets.super__Vector_base<std::bitset<448UL>,_std::allocator<std::bitset<448UL>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
  progress = 0;
  local_d0 = 0;
  local_108.indices = (collection *)(end._M_elems + 2);
  local_108.end = (collection *)&i;
  local_108.this_count = &progress;
  local_108.binary_sets = (vector<std::bitset<448UL>,_std::allocator<std::bitset<448UL>_>_> *)&n;
  local_108.n = &N;
  local_108.best =
       (pair<unsigned_long,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
        *)local_b0;
  local_108.progress = &local_d0;
  __range1 = (vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
              *)std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::size(names);
  ProgressIndicator<std::exception,get_max_cover_static2<448ul,3>(std::vector<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::allocator<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>const&,std::unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,bool)::_lambda()_1_,unsigned_long&,unsigned_long,unsigned_long&,unsigned_long_const&>
            ("\r%zu/%zu @ %zu/%zu",(bool)(bVar2 & 1),&local_108,(unsigned_long *)local_b0,
             (unsigned_long *)&__range1,&local_d0,indices._M_elems + 2);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(ulong)local_b0);
  poVar6 = std::operator<<(poVar6,'/');
  sVar7 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::size(names);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar7);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  __end0 = std::
           vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
           ::begin((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                    *)&best);
  collection = (array<unsigned_long,_3UL> *)
               std::
               vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
               ::end((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                      *)&best);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::array<unsigned_long,_3UL>_*,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
                                *)&collection);
    if (!bVar3) break;
    this = __gnu_cxx::
           __normal_iterator<std::array<unsigned_long,_3UL>_*,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
           ::operator*(&__end0);
    pvVar8 = std::array<unsigned_long,_3UL>::operator[](this,0);
    std::ostream::operator<<((ostream *)&std::cout,*pvVar8);
    for (local_138 = 1; local_138 < 3; local_138 = local_138 + 1) {
      poVar6 = std::operator<<((ostream *)&std::cout,'\t');
      pvVar8 = std::array<unsigned_long,_3UL>::operator[](this,local_138);
      std::ostream::operator<<(poVar6,*pvVar8);
    }
    std::operator<<((ostream *)&std::cout,'\n');
    __gnu_cxx::
    __normal_iterator<std::array<unsigned_long,_3UL>_*,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
    ::operator++(&__end0);
  }
  std::
  pair<unsigned_long,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
  ::~pair((pair<unsigned_long,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
           *)local_b0);
  std::vector<std::bitset<448UL>,_std::allocator<std::bitset<448UL>_>_>::~vector
            ((vector<std::bitset<448UL>,_std::allocator<std::bitset<448UL>_>_> *)&n);
  return;
}

Assistant:

void get_max_cover_static2(const std::vector<Set>& sets, const std::unordered_map<std::string, size_t>& names,
    const std::vector<size_t>& _begin, const std::vector<size_t>& _end, bool print_progress = false)
{
    const std::vector<std::bitset<n_entities>> binary_sets = BitSetsFromSets<n_entities>(sets, names);
    const auto n = sets.size();
    const auto N = nchoosek(n, k);
    
    typedef std::array<size_t, k> collection;
    
    collection indices, end;

    for (size_t i = 0; i < k; ++i)
    {
        indices[i] = _begin[i];
        end[i] = _end[i];
    }

    std::pair<size_t, std::vector<collection>> best;
    best.first = 0; best.second.clear();
    size_t this_count = 0;
    size_t progress = 0;
    ProgressIndicator("\r%zu/%zu @ %zu/%zu", print_progress, [&]()
    {
        int i;
        int b = 0; // first index where 'indices' and 'end' differ
        for (; b < k; ++b)
            if (indices[b] != end[b])
                break;

        // https://docs.python.org/2/library/itertools.html#itertools.combinations
        while (running && b < k)
        {
            //for (auto x : indices)
            //    std::cerr << x << '\t';
            //std::cerr << std::endl;

            this_count = sets_union(binary_sets, indices);
            if (this_count > best.first)
            {
                best.second.clear();
                best.second.push_back(indices);
                best.first = this_count;
            }
            else if (this_count == best.first)
            {
                best.second.push_back(indices);
            }
            ++progress;

            for (i = k - 1; i >= b; --i)
                if (indices[i] != (i + n) - k)
                    break;

            if (i < b)
                break;

            indices[i] += 1;
            for (size_t j = i + 1; j < k; ++j)
                indices[j] = indices[j - 1] + 1;
            if (i == b) // recalculates place of first differ
                for (; b < k; ++b)
                    if (indices[b] != end[b])
                        break;
        }
    }, best.first, names.size(), progress, N);
    
    std::cout << best.first << '/' << names.size() << std::endl;
    for (const auto& collection : best.second)
    {
        std::cout << collection[0];
        for (size_t j = 1; j < k; ++j)
        {
            std::cout << '\t' << collection[j];
        }
        std::cout << '\n';
    }
}